

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *this)

{
  _Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false> _Var1;
  Stack<std::unique_ptr<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>_>
  *this_00;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl;
  if (((_Var1._M_head_impl != (Stack<Lib::List<Kernel::Formula_*>_*> *)0x0) &&
      ((_Var1._M_head_impl)->_capacity != 0)) &&
     (Recycled<Lib::Stack<Lib::List<Kernel::Formula*>*>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
      ::memAlive == '\x01')) {
    (_Var1._M_head_impl)->_cursor = (_Var1._M_head_impl)->_stack;
    this_00 = mem();
    _Var1._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl =
         (Stack<Lib::List<Kernel::Formula_*>_*> *)0x0;
    if (this_00->_cursor == this_00->_end) {
      Stack<std::unique_ptr<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>_>
      ::expand(this_00);
    }
    (this_00->_cursor->_M_t).
    super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    this_00->_cursor = this_00->_cursor + 1;
  }
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Stack<Lib::List<Kernel::Formula_*>_*> *)0x0) {
    std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>::operator()
              ((default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_> *)this,
               _Var1._M_head_impl);
  }
  (this->_self)._M_t.
  super___uniq_ptr_impl<Lib::Stack<Lib::List<Kernel::Formula_*>_*>,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_std::default_delete<Lib::Stack<Lib::List<Kernel::Formula_*>_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Lib::List<Kernel::Formula_*>_*>_*,_false>._M_head_impl =
       (Stack<Lib::List<Kernel::Formula_*>_*> *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }